

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O2

int get_line_thickness(Am_Object *obj)

{
  Am_Value *in_value;
  Am_Wrapper *pAVar1;
  int iVar2;
  short thickness;
  Am_Style ls;
  Am_Line_Cap_Style_Flag cap;
  
  iVar2 = 0;
  in_value = Am_Object::Get(obj,0x6b,0);
  Am_Style::Am_Style(&ls,in_value);
  pAVar1 = Am_Style::operator_cast_to_Am_Wrapper_(&ls);
  if (pAVar1 != (Am_Wrapper *)0x0) {
    Am_Style::Get_Line_Thickness_Values(&ls,&thickness,&cap);
    iVar2 = (int)(short)(thickness + (ushort)(thickness == 0));
  }
  Am_Style::~Am_Style(&ls);
  return iVar2;
}

Assistant:

int
get_line_thickness(Am_Object obj)
{
  Am_Style ls = obj.Get(Am_LINE_STYLE);
  if (ls) {
    Am_Line_Cap_Style_Flag cap;
    short thickness;
    ls.Get_Line_Thickness_Values(thickness, cap);
    return thickness ? thickness : 1;
  } else
    return 0; // no thickness because no line_style
}